

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardReporter.cpp
# Opt level: O2

void ApprovalTests::ClipboardReporter::copyToClipboard(string *newClipboard)

{
  bool bVar1;
  string clipboardCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cmd;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  bVar1 = SystemUtils::isWindowsOs();
  if (!bVar1) {
    SystemUtils::isMacOs();
  }
  ::std::__cxx11::string::assign((char *)&local_a8);
  ::std::__cxx11::string::string((string *)&local_88,"echo ",&local_a9);
  ::std::operator+(&local_68,&local_88,newClipboard);
  ::std::operator+(&local_48,&local_68," | ");
  ::std::operator+(&local_28,&local_48,&local_a8);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_88);
  SystemUtils::runSystemCommandOrThrow(&local_28,false);
  ::std::__cxx11::string::~string((string *)&local_28);
  ::std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void ClipboardReporter::copyToClipboard(const std::string& newClipboard)
    {
        /*
     This will probably not work on Linux.

     From https://stackoverflow.com/a/750466/104370
     In case of X, yes, there's xclip (and others). xclip -selection c will send data to the clipboard that
     works with Ctrl-C, Ctrl-V in most applications.

     If you're trying to talk to the Mac OS X clipboard, there's pbcopy.

     If you're in Linux terminal mode (no X) then maybe you need to look into gpm.

     There's also GNU screen which has a clipboard. To put stuff in there, look at the screen command "readreg".

     Under Windows/cygwin, use /dev/clipboard or clip for newer versions of Windows (at least Windows 10).
     */

        std::string clipboardCommand;
        if (SystemUtils::isWindowsOs())
        {
            clipboardCommand = "clip";
        }
        else if (SystemUtils::isMacOs())
        {
            clipboardCommand = "pbcopy";
        }
        else
        {
            clipboardCommand = "pbclip";
        }
        auto cmd = std::string("echo ") + newClipboard + " | " + clipboardCommand;
        SystemUtils::runSystemCommandOrThrow(cmd);
    }